

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_ptr.hpp
# Opt level: O2

void __thiscall
nonstd::vptr::detail::
compressed_ptr<std::pair<char,_(anonymous_namespace)::S>,_nonstd::vptr::detail::default_clone<std::pair<char,_(anonymous_namespace)::S>_>,_std::default_delete<std::pair<char,_(anonymous_namespace)::S>_>_>
::reset(compressed_ptr<std::pair<char,_(anonymous_namespace)::S>,_nonstd::vptr::detail::default_clone<std::pair<char,_(anonymous_namespace)::S>_>,_std::default_delete<std::pair<char,_(anonymous_namespace)::S>_>_>
        *this,element_type *v)

{
  pointer ppVar1;
  
  ppVar1 = (pointer)operator_new(0x10);
  ppVar1->first = v->first;
  (ppVar1->second).state = move_constructed;
  (ppVar1->second).value = (v->second).value;
  (v->second).state = moved_from;
  operator_delete(this->ptr,0x10);
  this->ptr = ppVar1;
  return;
}

Assistant:

void reset( element_type && v )
    {
        reset( get_cloner()( std::move( v ) ) );
    }